

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O3

string * tao::pegtl::internal::demangle<ovf::detail::parse::v2::keyword_value_line>(void)

{
  char *__s;
  string *in_RDI;
  
  __s = (char *)__cxa_demangle("N3ovf6detail5parse2v218keyword_value_lineE",0,0,0);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (__s == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
    free(__s);
  }
  return in_RDI;
}

Assistant:

std::string demangle()
         {
#if defined( TAO_PEGTL_RTTI_ENABLED )
            return demangle( typeid( T ).name() );
#else
            const char* start = nullptr;
            const char* stop = nullptr;
#if defined( __clang__ ) || defined( __GNUC__ )
            start = std::strchr( __PRETTY_FUNCTION__, '=' ) + 2;
            stop = std::strrchr( start, ';' );
#elif defined( _MSC_VER )
            start = std::strstr( __FUNCSIG__, "demangle<" ) + ( sizeof( "demangle<" ) - 1 );
            stop = std::strrchr( start, '>' );
#else
            static_assert( false, "expected to use rtti with this compiler" );
#endif
            assert( start != nullptr );
            assert( stop != nullptr );
            return { start, std::size_t( stop - start ) };
#endif
         }